

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void ColorPhiWebs(VmFunction *function)

{
  uint color;
  VmInstruction *local_20;
  VmInstruction *inst;
  VmBlock *block;
  VmFunction *function_local;
  
  function->nextColor = 0;
  for (inst = (VmInstruction *)function->firstBlock; inst != (VmInstruction *)0x0;
      inst = (VmInstruction *)(inst->arguments).little[2]) {
    for (local_20 = (VmInstruction *)(inst->arguments).little[3]; local_20 != (VmInstruction *)0x0;
        local_20 = local_20->nextSibling) {
      if ((local_20->cmd == VM_INST_PHI) && (local_20->color == 0)) {
        color = function->nextColor + 1;
        function->nextColor = color;
        ColorPhiWeb(local_20,color);
      }
    }
  }
  return;
}

Assistant:

void ColorPhiWebs(VmFunction* function)
{
	function->nextColor = 0;

	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		for(VmInstruction *inst = block->firstInstruction; inst; inst = inst->nextSibling)
		{
			if(inst->cmd == VM_INST_PHI && inst->color == 0)
				ColorPhiWeb(inst, ++function->nextColor);
		}
	}
}